

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegdec.c
# Opt level: O0

int StoreICCP(j_decompress_ptr dinfo,MetadataPayload *iccp)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  long *in_RSI;
  long in_RDI;
  size_t offset;
  int i;
  ICCPSegment *segment;
  size_t segment_size;
  int count;
  int seq;
  jpeg_saved_marker_ptr_conflict marker;
  ICCPSegment iccp_segments [255];
  size_t total_size;
  int seq_max;
  int actual_count;
  int expected_count;
  long local_1848;
  int local_183c;
  ulong local_1830;
  undefined8 local_1828;
  undefined8 *local_1820;
  ulong local_1818 [2];
  size_t asStack_1808 [763];
  size_t local_30;
  uint local_24;
  uint local_20;
  uint local_1c;
  long *local_18;
  long local_10;
  int local_4;
  
  local_1c = 0;
  local_20 = 0;
  local_24 = 0;
  local_30 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_1818,0,0x17e8);
  local_1820 = *(undefined8 **)(local_10 + 400);
  do {
    if (local_1820 == (undefined8 *)0x0) {
      if (local_20 == 0) {
        local_4 = 1;
      }
      else if (local_24 == local_20) {
        if (local_1c == local_20) {
          qsort(local_1818,(long)(int)local_20,0x18,CompareICCPSegments);
          pvVar3 = malloc(local_30);
          *local_18 = (long)pvVar3;
          if (*local_18 == 0) {
            local_4 = 0;
          }
          else {
            local_18[1] = local_30;
            local_1848 = 0;
            for (local_183c = 0; local_183c < (int)local_24; local_183c = local_183c + 1) {
              memcpy((void *)(*local_18 + local_1848),(void *)local_1818[(long)local_183c * 3],
                     asStack_1808[(long)local_183c * 3 + -1]);
              local_1848 = asStack_1808[(long)local_183c * 3 + -1] + local_1848;
            }
            local_4 = 1;
          }
        }
        else {
          fprintf(_stderr,"[ICCP] Segment count: %d does not match expected: %d!\n",(ulong)local_20,
                  (ulong)local_1c);
          local_4 = 0;
        }
      }
      else {
        fprintf(_stderr,"[ICCP] Discontinuous segments, expected: %d actual: %d!\n",(ulong)local_20,
                (ulong)local_24);
        local_4 = 0;
      }
      return local_4;
    }
    if (((*(char *)(local_1820 + 1) == -0x1e) && (0xe < *(uint *)(local_1820 + 2))) &&
       (iVar2 = memcmp((void *)local_1820[3],"ICC_PROFILE",0xc), iVar2 == 0)) {
      local_1828._4_4_ = (uint)*(byte *)(local_1820[3] + 0xc);
      local_1828._0_4_ = (uint)*(byte *)(local_1820[3] + 0xd);
      local_1830 = (ulong)*(uint *)(local_1820 + 2) - 0xe;
      if (((local_1830 == 0) || ((uint)local_1828 == 0)) || (local_1828._4_4_ == 0)) {
        fprintf(_stderr,"[ICCP] size (%d) / count (%d) / sequence number (%d) cannot be 0!\n",
                local_1830 & 0xffffffff,(ulong)local_1828._4_4_,(ulong)(uint)local_1828);
        return 0;
      }
      uVar1 = (uint)local_1828;
      if ((local_1c != 0) && (uVar1 = local_1c, local_1c != (uint)local_1828)) {
        fprintf(_stderr,"[ICCP] Inconsistent segment count (%d / %d)!\n",(ulong)local_1c,
                (ulong)(uint)local_1828);
        return 0;
      }
      local_1c = uVar1;
      lVar4 = (long)(int)local_1828._4_4_;
      if (*(long *)((long)&local_1828 + lVar4 * 6 * 4) != 0) {
        fprintf(_stderr,"[ICCP] Duplicate segment number (%d)!\n",(ulong)local_1828._4_4_);
        return 0;
      }
      (&local_1830)[lVar4 * 3] = local_1820[3] + 0xe;
      *(ulong *)((long)&local_1828 + lVar4 * 6 * 4) = local_1830;
      *(uint *)(&local_1820 + lVar4 * 3) = local_1828._4_4_;
      local_30 = local_1830 + local_30;
      if ((int)local_24 < (int)local_1828._4_4_) {
        local_24 = local_1828._4_4_;
      }
      local_20 = local_20 + 1;
    }
    local_1820 = (undefined8 *)*local_1820;
  } while( true );
}

Assistant:

static int StoreICCP(j_decompress_ptr dinfo, MetadataPayload* const iccp) {
  // ICC.1:2010-12 (4.3.0.0) Annex B.4 Embedding ICC Profiles in JPEG files
  static const char kICCPSignature[] = "ICC_PROFILE";
  static const size_t kICCPSignatureLength = 12;  // signature includes '\0'
  static const size_t kICCPSkipLength = 14;  // signature + seq & count
  int expected_count = 0;
  int actual_count = 0;
  int seq_max = 0;
  size_t total_size = 0;
  ICCPSegment iccp_segments[255];
  jpeg_saved_marker_ptr marker;

  memset(iccp_segments, 0, sizeof(iccp_segments));
  for (marker = dinfo->marker_list; marker != NULL; marker = marker->next) {
    if (marker->marker == JPEG_APP2 &&
        marker->data_length > kICCPSkipLength &&
        !memcmp(marker->data, kICCPSignature, kICCPSignatureLength)) {
      // ICC_PROFILE\0<seq><count>; 'seq' starts at 1.
      const int seq = marker->data[kICCPSignatureLength];
      const int count = marker->data[kICCPSignatureLength + 1];
      const size_t segment_size = marker->data_length - kICCPSkipLength;
      ICCPSegment* segment;

      if (segment_size == 0 || count == 0 || seq == 0) {
        fprintf(stderr, "[ICCP] size (%d) / count (%d) / sequence number (%d)"
                        " cannot be 0!\n",
                (int)segment_size, seq, count);
        return 0;
      }

      if (expected_count == 0) {
        expected_count = count;
      } else if (expected_count != count) {
        fprintf(stderr, "[ICCP] Inconsistent segment count (%d / %d)!\n",
                expected_count, count);
        return 0;
      }

      segment = iccp_segments + seq - 1;
      if (segment->data_length != 0) {
        fprintf(stderr, "[ICCP] Duplicate segment number (%d)!\n" , seq);
        return 0;
      }

      segment->data = marker->data + kICCPSkipLength;
      segment->data_length = segment_size;
      segment->seq = seq;
      total_size += segment_size;
      if (seq > seq_max) seq_max = seq;
      ++actual_count;
    }
  }

  if (actual_count == 0) return 1;
  if (seq_max != actual_count) {
    fprintf(stderr, "[ICCP] Discontinuous segments, expected: %d actual: %d!\n",
            actual_count, seq_max);
    return 0;
  }
  if (expected_count != actual_count) {
    fprintf(stderr, "[ICCP] Segment count: %d does not match expected: %d!\n",
            actual_count, expected_count);
    return 0;
  }

  // The segments may appear out of order in the file, sort them based on
  // sequence number before assembling the payload.
  qsort(iccp_segments, actual_count, sizeof(*iccp_segments),
        CompareICCPSegments);

  iccp->bytes = (uint8_t*)malloc(total_size);
  if (iccp->bytes == NULL) return 0;
  iccp->size = total_size;

  {
    int i;
    size_t offset = 0;
    for (i = 0; i < seq_max; ++i) {
      memcpy(iccp->bytes + offset,
             iccp_segments[i].data, iccp_segments[i].data_length);
      offset += iccp_segments[i].data_length;
    }
  }
  return 1;
}